

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_rotate.cpp
# Opt level: O3

size_t embree::avx::BVHNRotate<4>::rotate(NodeRef parentRef,size_t depth)

{
  long lVar1;
  long lVar2;
  float fVar3;
  undefined1 auVar4 [16];
  undefined8 uVar5;
  size_t sVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  undefined4 uVar11;
  long in_R8;
  ulong uVar13;
  long lVar14;
  long in_R9;
  ulong uVar15;
  long in_R10;
  ulong uVar16;
  size_t c;
  long lVar17;
  bool bVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  int pos [4];
  vint4 cdepth;
  vfloat4 area0123;
  vfloat4 childArea;
  float local_1ac;
  int local_1a8 [4];
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  float local_38 [4];
  ulong uVar12;
  
  if ((parentRef.ptr & 0x8000000000000008) == 0) {
    lVar17 = 0;
    do {
      sVar6 = rotate((NodeRef)*(size_t *)(parentRef.ptr + lVar17 * 8),depth + 1);
      *(int *)(local_198 + lVar17 * 4) = (int)sVar6;
      lVar17 = lVar17 + 1;
    } while (lVar17 != 4);
    auVar26 = *(undefined1 (*) [16])(parentRef.ptr + 0x20);
    auVar22 = *(undefined1 (*) [16])(parentRef.ptr + 0x30);
    auVar23 = *(undefined1 (*) [16])(parentRef.ptr + 0x40);
    auVar4 = *(undefined1 (*) [16])(parentRef.ptr + 0x50);
    auVar29 = vsubps_avx(auVar22,auVar26);
    auVar24 = vsubps_avx(auVar4,auVar23);
    auVar19 = *(undefined1 (*) [16])(parentRef.ptr + 0x70);
    auVar20 = *(undefined1 (*) [16])(parentRef.ptr + 0x60);
    auVar27 = vsubps_avx(auVar19,auVar20);
    local_38[0] = auVar27._0_4_ * auVar24._0_4_ + (auVar27._0_4_ + auVar24._0_4_) * auVar29._0_4_;
    local_38[1] = auVar27._4_4_ * auVar24._4_4_ + (auVar27._4_4_ + auVar24._4_4_) * auVar29._4_4_;
    local_38[2] = auVar27._8_4_ * auVar24._8_4_ + (auVar27._8_4_ + auVar24._8_4_) * auVar29._8_4_;
    local_38[3] = auVar27._12_4_ * auVar24._12_4_ +
                  (auVar27._12_4_ + auVar24._12_4_) * auVar29._12_4_;
    auVar29 = vunpcklps_avx(auVar26,auVar20);
    auVar26 = vunpckhps_avx(auVar26,auVar20);
    auVar24 = ZEXT816(0) << 0x20;
    auVar20 = vunpcklps_avx(auVar23,auVar24);
    auVar23 = vunpckhps_avx(auVar23,auVar24);
    local_c8 = vunpcklps_avx(auVar29,auVar20);
    local_d8 = vunpckhps_avx(auVar29,auVar20);
    local_e8 = vunpcklps_avx(auVar26,auVar23);
    local_f8 = vunpckhps_avx(auVar26,auVar23);
    auVar23 = vunpcklps_avx(auVar22,auVar19);
    auVar26 = vunpckhps_avx(auVar22,auVar19);
    auVar19 = vunpcklps_avx(auVar4,auVar24);
    auVar22 = vunpckhps_avx(auVar4,auVar24);
    local_108 = vunpcklps_avx(auVar23,auVar19);
    local_118 = vunpckhps_avx(auVar23,auVar19);
    local_128 = vunpcklps_avx(auVar26,auVar22);
    local_138 = vunpckhps_avx(auVar26,auVar22);
    auVar26 = vpshufd_avx(ZEXT416((int)depth + 1),0);
    auVar26 = vpaddd_avx(auVar26,local_198);
    lVar17 = -1;
    local_1ac = 0.0;
    lVar10 = 0;
    auVar22._8_4_ = 0x20;
    auVar22._0_8_ = 0x2000000020;
    auVar22._12_4_ = 0x20;
    local_148 = vpcmpgtd_avx(auVar26,auVar22);
    lVar7 = -1;
    lVar9 = -1;
    do {
      uVar12 = *(ulong *)(parentRef.ptr + lVar10 * 8);
      if ((uVar12 & 0x8000000000000008) == 0) {
        auVar23 = vunpcklps_avx(*(undefined1 (*) [16])(uVar12 + 0x20),
                                *(undefined1 (*) [16])(uVar12 + 0x60));
        auVar26 = vunpckhps_avx(*(undefined1 (*) [16])(uVar12 + 0x20),
                                *(undefined1 (*) [16])(uVar12 + 0x60));
        auVar19 = ZEXT816(0) << 0x40;
        auVar4 = vunpcklps_avx(*(undefined1 (*) [16])(uVar12 + 0x40),auVar19);
        auVar22 = vunpckhps_avx(*(undefined1 (*) [16])(uVar12 + 0x40),auVar19);
        local_178 = vunpcklps_avx(auVar23,auVar4);
        local_78 = vunpckhps_avx(auVar23,auVar4);
        local_b8 = vunpcklps_avx(auVar26,auVar22);
        local_168 = vunpckhps_avx(auVar26,auVar22);
        auVar23 = vunpcklps_avx(*(undefined1 (*) [16])(uVar12 + 0x30),
                                *(undefined1 (*) [16])(uVar12 + 0x70));
        auVar26 = vunpckhps_avx(*(undefined1 (*) [16])(uVar12 + 0x30),
                                *(undefined1 (*) [16])(uVar12 + 0x70));
        auVar4 = vunpcklps_avx(*(undefined1 (*) [16])(uVar12 + 0x50),auVar19);
        auVar22 = vunpckhps_avx(*(undefined1 (*) [16])(uVar12 + 0x50),auVar19);
        local_158 = vunpcklps_avx(auVar23,auVar4);
        local_a8 = vunpckhps_avx(auVar23,auVar4);
        local_98 = vunpcklps_avx(auVar26,auVar22);
        local_88 = vunpckhps_avx(auVar26,auVar22);
        auVar22 = vminps_avx(local_c8,local_78);
        auVar26 = vmaxps_avx(local_108,local_a8);
        local_188 = vminps_avx(local_b8,local_168);
        auVar4 = vmaxps_avx(local_98,local_88);
        auVar22 = vminps_avx(auVar22,local_188);
        auVar26 = vmaxps_avx(auVar26,auVar4);
        auVar22 = vsubps_avx(auVar26,auVar22);
        auVar26 = vshufps_avx(auVar22,auVar22,0xc9);
        auVar29._0_4_ = auVar22._0_4_ * auVar26._0_4_;
        auVar29._4_4_ = auVar22._4_4_ * auVar26._4_4_;
        auVar29._8_4_ = auVar22._8_4_ * auVar26._8_4_;
        auVar29._12_4_ = auVar22._12_4_ * auVar26._12_4_;
        auVar22 = vminps_avx(local_178,local_c8);
        auVar26 = vmaxps_avx(local_158,local_108);
        auVar22 = vminps_avx(auVar22,local_188);
        auVar26 = vmaxps_avx(auVar26,auVar4);
        auVar22 = vsubps_avx(auVar26,auVar22);
        auVar26 = vshufps_avx(auVar22,auVar22,0xc9);
        auVar35._0_4_ = auVar22._0_4_ * auVar26._0_4_;
        auVar35._4_4_ = auVar22._4_4_ * auVar26._4_4_;
        auVar35._8_4_ = auVar22._8_4_ * auVar26._8_4_;
        auVar35._12_4_ = auVar22._12_4_ * auVar26._12_4_;
        auVar20 = vminps_avx(local_178,local_78);
        auVar19 = vmaxps_avx(local_158,local_a8);
        auVar22 = vminps_avx(local_c8,local_168);
        auVar26 = vmaxps_avx(local_108,local_88);
        auVar22 = vminps_avx(auVar20,auVar22);
        auVar26 = vmaxps_avx(auVar19,auVar26);
        auVar22 = vsubps_avx(auVar26,auVar22);
        auVar26 = vshufps_avx(auVar22,auVar22,0xc9);
        auVar39._0_4_ = auVar26._0_4_ * auVar22._0_4_;
        auVar39._4_4_ = auVar26._4_4_ * auVar22._4_4_;
        auVar39._8_4_ = auVar26._8_4_ * auVar22._8_4_;
        auVar39._12_4_ = auVar26._12_4_ * auVar22._12_4_;
        auVar26 = vminps_avx(local_b8,local_c8);
        auVar22 = vminps_avx(auVar20,auVar26);
        auVar26 = vmaxps_avx(local_98,local_108);
        auVar26 = vmaxps_avx(auVar19,auVar26);
        auVar22 = vsubps_avx(auVar26,auVar22);
        auVar26 = vshufps_avx(auVar22,auVar22,0xc9);
        auVar42._0_4_ = auVar22._0_4_ * auVar26._0_4_;
        auVar42._4_4_ = auVar22._4_4_ * auVar26._4_4_;
        auVar42._8_4_ = auVar22._8_4_ * auVar26._8_4_;
        auVar42._12_4_ = auVar22._12_4_ * auVar26._12_4_;
        auVar26 = vunpcklps_avx(auVar29,auVar35);
        auVar26 = vmovlhps_avx(auVar26,auVar39);
        auVar26 = vinsertps_avx(auVar26,auVar42,0x30);
        auVar22 = vinsertps_avx(auVar35,auVar29,0x4c);
        auVar22 = vshufps_avx(auVar22,auVar39,0xd4);
        auVar22 = vinsertps_avx(auVar22,auVar42,0x70);
        auVar23 = vunpckhps_avx(auVar29,auVar35);
        auVar30._0_8_ = auVar23._0_8_;
        auVar30._8_8_ = auVar39._8_8_;
        auVar23 = vinsertps_avx(auVar30,auVar42,0xb0);
        auVar36._0_4_ = auVar26._0_4_ + auVar22._0_4_ + auVar23._0_4_;
        auVar36._4_4_ = auVar26._4_4_ + auVar22._4_4_ + auVar23._4_4_;
        auVar36._8_4_ = auVar26._8_4_ + auVar22._8_4_ + auVar23._8_4_;
        auVar36._12_4_ = auVar26._12_4_ + auVar22._12_4_ + auVar23._12_4_;
        auVar26 = vshufps_avx(auVar36,auVar36,0xb1);
        auVar26 = vminps_avx(auVar26,auVar36);
        auVar22 = vshufpd_avx(auVar26,auVar26,1);
        local_58 = vminps_avx(auVar22,auVar26);
        auVar26 = vcmpps_avx(local_58,auVar36,0);
        uVar11 = vmovmskps_avx(auVar26);
        uVar12 = CONCAT44((int)(uVar12 >> 0x20),uVar11);
        auVar22 = vminps_avx(local_d8,local_78);
        auVar26 = vmaxps_avx(local_118,local_a8);
        auVar22 = vminps_avx(auVar22,local_188);
        auVar26 = vmaxps_avx(auVar26,auVar4);
        auVar22 = vsubps_avx(auVar26,auVar22);
        auVar26 = vshufps_avx(auVar22,auVar22,0xc9);
        auVar37._0_4_ = auVar22._0_4_ * auVar26._0_4_;
        auVar37._4_4_ = auVar22._4_4_ * auVar26._4_4_;
        auVar37._8_4_ = auVar22._8_4_ * auVar26._8_4_;
        auVar37._12_4_ = auVar22._12_4_ * auVar26._12_4_;
        auVar22 = vminps_avx(local_178,local_d8);
        auVar26 = vmaxps_avx(local_158,local_118);
        auVar22 = vminps_avx(auVar22,local_188);
        auVar26 = vmaxps_avx(auVar26,auVar4);
        auVar22 = vsubps_avx(auVar26,auVar22);
        auVar26 = vshufps_avx(auVar22,auVar22,0xc9);
        auVar40._0_4_ = auVar26._0_4_ * auVar22._0_4_;
        auVar40._4_4_ = auVar26._4_4_ * auVar22._4_4_;
        auVar40._8_4_ = auVar26._8_4_ * auVar22._8_4_;
        auVar40._12_4_ = auVar26._12_4_ * auVar22._12_4_;
        auVar26 = vminps_avx(local_d8,local_168);
        auVar22 = vminps_avx(auVar20,auVar26);
        auVar26 = vmaxps_avx(local_118,local_88);
        auVar26 = vmaxps_avx(auVar19,auVar26);
        auVar22 = vsubps_avx(auVar26,auVar22);
        auVar26 = vshufps_avx(auVar22,auVar22,0xc9);
        auVar43._0_4_ = auVar22._0_4_ * auVar26._0_4_;
        auVar43._4_4_ = auVar22._4_4_ * auVar26._4_4_;
        auVar43._8_4_ = auVar22._8_4_ * auVar26._8_4_;
        auVar43._12_4_ = auVar22._12_4_ * auVar26._12_4_;
        auVar26 = vminps_avx(local_b8,local_d8);
        auVar22 = vminps_avx(auVar20,auVar26);
        auVar26 = vmaxps_avx(local_98,local_118);
        auVar26 = vmaxps_avx(auVar19,auVar26);
        auVar22 = vsubps_avx(auVar26,auVar22);
        auVar26 = vshufps_avx(auVar22,auVar22,0xc9);
        auVar45._0_4_ = auVar22._0_4_ * auVar26._0_4_;
        auVar45._4_4_ = auVar22._4_4_ * auVar26._4_4_;
        auVar45._8_4_ = auVar22._8_4_ * auVar26._8_4_;
        auVar45._12_4_ = auVar22._12_4_ * auVar26._12_4_;
        auVar26 = vunpcklps_avx(auVar37,auVar40);
        auVar26 = vmovlhps_avx(auVar26,auVar43);
        auVar26 = vinsertps_avx(auVar26,auVar45,0x30);
        auVar22 = vinsertps_avx(auVar40,auVar37,0x4c);
        auVar22 = vshufps_avx(auVar22,auVar43,0xd4);
        auVar22 = vinsertps_avx(auVar22,auVar45,0x70);
        auVar23 = vunpckhps_avx(auVar37,auVar40);
        auVar38._0_8_ = auVar23._0_8_;
        auVar38._8_8_ = auVar43._8_8_;
        auVar23 = vinsertps_avx(auVar38,auVar45,0xb0);
        auVar31._0_4_ = auVar23._0_4_ + auVar26._0_4_ + auVar22._0_4_;
        auVar31._4_4_ = auVar23._4_4_ + auVar26._4_4_ + auVar22._4_4_;
        auVar31._8_4_ = auVar23._8_4_ + auVar26._8_4_ + auVar22._8_4_;
        auVar31._12_4_ = auVar23._12_4_ + auVar26._12_4_ + auVar22._12_4_;
        auVar26 = vshufps_avx(auVar31,auVar31,0xb1);
        auVar26 = vminps_avx(auVar26,auVar31);
        auVar22 = vshufpd_avx(auVar26,auVar26,1);
        local_68 = vminps_avx(auVar22,auVar26);
        auVar26 = vcmpps_avx(local_68,auVar31,0);
        uVar11 = vmovmskps_avx(auVar26);
        uVar13 = CONCAT44((int)((ulong)in_R8 >> 0x20),uVar11);
        auVar22 = vminps_avx(local_e8,local_78);
        auVar26 = vmaxps_avx(local_128,local_a8);
        auVar22 = vminps_avx(auVar22,local_188);
        auVar26 = vmaxps_avx(auVar26,auVar4);
        auVar22 = vsubps_avx(auVar26,auVar22);
        auVar26 = vshufps_avx(auVar22,auVar22,0xc9);
        auVar32._0_4_ = auVar22._0_4_ * auVar26._0_4_;
        auVar32._4_4_ = auVar22._4_4_ * auVar26._4_4_;
        auVar32._8_4_ = auVar22._8_4_ * auVar26._8_4_;
        auVar32._12_4_ = auVar22._12_4_ * auVar26._12_4_;
        auVar26 = vminps_avx(local_178,local_e8);
        auVar22 = vminps_avx(auVar26,local_188);
        auVar26 = vmaxps_avx(local_158,local_128);
        auVar26 = vmaxps_avx(auVar26,auVar4);
        auVar22 = vsubps_avx(auVar26,auVar22);
        auVar26 = vshufps_avx(auVar22,auVar22,0xc9);
        auVar41._0_4_ = auVar26._0_4_ * auVar22._0_4_;
        auVar41._4_4_ = auVar26._4_4_ * auVar22._4_4_;
        auVar41._8_4_ = auVar26._8_4_ * auVar22._8_4_;
        auVar41._12_4_ = auVar26._12_4_ * auVar22._12_4_;
        auVar26 = vminps_avx(local_e8,local_168);
        auVar22 = vminps_avx(auVar20,auVar26);
        auVar26 = vmaxps_avx(local_128,local_88);
        auVar26 = vmaxps_avx(auVar19,auVar26);
        auVar22 = vsubps_avx(auVar26,auVar22);
        auVar26 = vshufps_avx(auVar22,auVar22,0xc9);
        auVar44._0_4_ = auVar22._0_4_ * auVar26._0_4_;
        auVar44._4_4_ = auVar22._4_4_ * auVar26._4_4_;
        auVar44._8_4_ = auVar22._8_4_ * auVar26._8_4_;
        auVar44._12_4_ = auVar22._12_4_ * auVar26._12_4_;
        auVar26 = vminps_avx(local_b8,local_e8);
        auVar22 = vminps_avx(auVar20,auVar26);
        auVar26 = vmaxps_avx(local_98,local_128);
        auVar26 = vmaxps_avx(auVar19,auVar26);
        auVar22 = vsubps_avx(auVar26,auVar22);
        auVar26 = vshufps_avx(auVar22,auVar22,0xc9);
        auVar46._0_4_ = auVar22._0_4_ * auVar26._0_4_;
        auVar46._4_4_ = auVar22._4_4_ * auVar26._4_4_;
        auVar46._8_4_ = auVar22._8_4_ * auVar26._8_4_;
        auVar46._12_4_ = auVar22._12_4_ * auVar26._12_4_;
        auVar26 = vunpcklps_avx(auVar32,auVar41);
        auVar26 = vmovlhps_avx(auVar26,auVar44);
        auVar26 = vinsertps_avx(auVar26,auVar46,0x30);
        auVar22 = vinsertps_avx(auVar41,auVar32,0x4c);
        auVar22 = vshufps_avx(auVar22,auVar44,0xd4);
        auVar22 = vinsertps_avx(auVar22,auVar46,0x70);
        auVar23 = vunpckhps_avx(auVar32,auVar41);
        auVar33._0_8_ = auVar23._0_8_;
        auVar33._8_8_ = auVar44._8_8_;
        auVar23 = vinsertps_avx(auVar33,auVar46,0xb0);
        auVar34._0_4_ = auVar23._0_4_ + auVar26._0_4_ + auVar22._0_4_;
        auVar34._4_4_ = auVar23._4_4_ + auVar26._4_4_ + auVar22._4_4_;
        auVar34._8_4_ = auVar23._8_4_ + auVar26._8_4_ + auVar22._8_4_;
        auVar34._12_4_ = auVar23._12_4_ + auVar26._12_4_ + auVar22._12_4_;
        auVar26 = vshufps_avx(auVar34,auVar34,0xb1);
        auVar26 = vminps_avx(auVar26,auVar34);
        auVar22 = vshufpd_avx(auVar26,auVar26,1);
        auVar29 = vminps_avx(auVar22,auVar26);
        auVar26 = vcmpps_avx(auVar29,auVar34,0);
        uVar11 = vmovmskps_avx(auVar26);
        uVar15 = CONCAT44((int)((ulong)in_R9 >> 0x20),uVar11);
        auVar22 = vminps_avx(local_f8,local_78);
        auVar26 = vmaxps_avx(local_138,local_a8);
        auVar22 = vminps_avx(auVar22,local_188);
        auVar26 = vmaxps_avx(auVar26,auVar4);
        auVar22 = vsubps_avx(auVar26,auVar22);
        auVar26 = vshufps_avx(auVar22,auVar22,0xc9);
        auVar28._0_4_ = auVar22._0_4_ * auVar26._0_4_;
        auVar28._4_4_ = auVar22._4_4_ * auVar26._4_4_;
        auVar28._8_4_ = auVar22._8_4_ * auVar26._8_4_;
        auVar28._12_4_ = auVar22._12_4_ * auVar26._12_4_;
        auVar26 = vminps_avx(local_178,local_f8);
        auVar22 = vminps_avx(auVar26,local_188);
        auVar26 = vmaxps_avx(local_158,local_138);
        auVar26 = vmaxps_avx(auVar26,auVar4);
        auVar22 = vsubps_avx(auVar26,auVar22);
        auVar26 = vshufps_avx(auVar22,auVar22,0xc9);
        auVar23._0_4_ = auVar22._0_4_ * auVar26._0_4_;
        auVar23._4_4_ = auVar22._4_4_ * auVar26._4_4_;
        auVar23._8_4_ = auVar22._8_4_ * auVar26._8_4_;
        auVar23._12_4_ = auVar22._12_4_ * auVar26._12_4_;
        auVar22 = vminps_avx(local_f8,local_168);
        auVar26 = vmaxps_avx(local_138,local_88);
        auVar22 = vminps_avx(auVar20,auVar22);
        auVar26 = vmaxps_avx(auVar19,auVar26);
        auVar22 = vsubps_avx(auVar26,auVar22);
        auVar26 = vshufps_avx(auVar22,auVar22,0xc9);
        auVar27._0_4_ = auVar22._0_4_ * auVar26._0_4_;
        auVar27._4_4_ = auVar22._4_4_ * auVar26._4_4_;
        auVar27._8_4_ = auVar22._8_4_ * auVar26._8_4_;
        auVar27._12_4_ = auVar22._12_4_ * auVar26._12_4_;
        auVar26 = vminps_avx(local_b8,local_f8);
        auVar22 = vminps_avx(auVar20,auVar26);
        auVar26 = vmaxps_avx(local_98,local_138);
        auVar26 = vmaxps_avx(auVar19,auVar26);
        auVar22 = vsubps_avx(auVar26,auVar22);
        auVar26 = vshufps_avx(auVar22,auVar22,0xc9);
        auVar19._0_4_ = auVar22._0_4_ * auVar26._0_4_;
        auVar19._4_4_ = auVar22._4_4_ * auVar26._4_4_;
        auVar19._8_4_ = auVar22._8_4_ * auVar26._8_4_;
        auVar19._12_4_ = auVar22._12_4_ * auVar26._12_4_;
        auVar26 = vunpcklps_avx(auVar28,auVar23);
        auVar26 = vmovlhps_avx(auVar26,auVar27);
        auVar26 = vinsertps_avx(auVar26,auVar19,0x30);
        auVar22 = vinsertps_avx(auVar23,auVar28,0x4c);
        auVar22 = vshufps_avx(auVar22,auVar27,0xd4);
        auVar22 = vinsertps_avx(auVar22,auVar19,0x70);
        auVar23 = vunpckhps_avx(auVar28,auVar23);
        auVar4 = vpcmpeqd_avx(auVar28,auVar28);
        auVar24._0_8_ = auVar23._0_8_;
        auVar24._8_8_ = auVar27._8_8_;
        auVar23 = vinsertps_avx(auVar24,auVar19,0xb0);
        auVar20._0_4_ = auVar23._0_4_ + auVar26._0_4_ + auVar22._0_4_;
        auVar20._4_4_ = auVar23._4_4_ + auVar26._4_4_ + auVar22._4_4_;
        auVar20._8_4_ = auVar23._8_4_ + auVar26._8_4_ + auVar22._8_4_;
        auVar20._12_4_ = auVar23._12_4_ + auVar26._12_4_ + auVar22._12_4_;
        auVar26 = vshufps_avx(auVar20,auVar20,0xb1);
        auVar26 = vminps_avx(auVar26,auVar20);
        auVar22 = vshufpd_avx(auVar26,auVar26,1);
        auVar22 = vminps_avx(auVar22,auVar26);
        auVar26 = vcmpps_avx(auVar22,auVar20,0);
        uVar11 = vmovmskps_avx(auVar26);
        uVar16 = CONCAT44((int)((ulong)in_R10 >> 0x20),uVar11);
        auVar26 = vunpcklps_avx(local_58,local_68);
        auVar26 = vmovlhps_avx(auVar26,auVar29);
        lVar8 = 0;
        if (uVar12 != 0) {
          for (; (uVar12 >> lVar8 & 1) == 0; lVar8 = lVar8 + 1) {
          }
        }
        in_R8 = 0;
        if (uVar13 != 0) {
          for (; (uVar13 >> in_R8 & 1) == 0; in_R8 = in_R8 + 1) {
          }
        }
        in_R9 = 0;
        if (uVar15 != 0) {
          for (; (uVar15 >> in_R9 & 1) == 0; in_R9 = in_R9 + 1) {
          }
        }
        in_R10 = 0;
        if (uVar16 != 0) {
          for (; (uVar16 >> in_R10 & 1) == 0; in_R10 = in_R10 + 1) {
          }
        }
        auVar26 = vinsertps_avx(auVar26,auVar22,0x30);
        fVar3 = local_38[lVar10];
        auVar25._4_4_ = fVar3;
        auVar25._0_4_ = fVar3;
        auVar25._8_4_ = fVar3;
        auVar25._12_4_ = fVar3;
        local_48 = vsubps_avx(auVar26,auVar25);
        local_1a8[0] = (int)lVar8;
        local_1a8[1] = (int)in_R8;
        local_1a8[2] = (int)in_R9;
        local_1a8[3] = (int)in_R10;
        auVar26 = vpshufd_avx(ZEXT416((uint)lVar10),0);
        auVar26 = vpcmpeqd_avx(auVar26,_DAT_01f7fcf0);
        auVar26 = vpor_avx(auVar26,local_148);
        auVar22 = auVar4 & ~auVar26;
        if ((((auVar22 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar22 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar22 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar22[0xf] < '\0') {
          auVar21._0_4_ = auVar26._0_4_ ^ auVar4._0_4_;
          auVar21._4_4_ = auVar26._4_4_ ^ auVar4._4_4_;
          auVar21._8_4_ = auVar26._8_4_ ^ auVar4._8_4_;
          auVar21._12_4_ = auVar26._12_4_ ^ auVar4._12_4_;
          auVar26._8_4_ = 0x7f800000;
          auVar26._0_8_ = 0x7f8000007f800000;
          auVar26._12_4_ = 0x7f800000;
          auVar26 = vblendvps_avx(auVar26,local_48,auVar21);
          auVar22 = vshufps_avx(auVar26,auVar26,0xb1);
          auVar22 = vminps_avx(auVar22,auVar26);
          auVar23 = vshufpd_avx(auVar22,auVar22,1);
          auVar22 = vminps_avx(auVar23,auVar22);
          auVar26 = vcmpps_avx(auVar26,auVar22,0);
          auVar22 = auVar21 & auVar26;
          if ((((auVar22 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar22 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar22 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar22[0xf] < '\0') {
            auVar21 = vandps_avx(auVar26,auVar21);
          }
          uVar11 = vmovmskps_avx(auVar21);
          uVar12 = CONCAT44((int)((ulong)lVar8 >> 0x20),uVar11);
          lVar8 = 0;
          if (uVar12 != 0) {
            for (; (uVar12 >> lVar8 & 1) == 0; lVar8 = lVar8 + 1) {
            }
          }
          if ((lVar10 != lVar8) && (local_38[lVar8 + -4] < local_1ac)) {
            lVar9 = (long)local_1a8[lVar8];
            lVar17 = lVar8;
            lVar7 = lVar10;
            local_1ac = local_38[lVar8 + -4];
          }
        }
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 != 4);
    if (lVar17 != -1) {
      lVar10 = *(long *)(parentRef.ptr + lVar7 * 8);
      uVar5 = *(undefined8 *)(parentRef.ptr + lVar17 * 8);
      *(undefined8 *)(parentRef.ptr + lVar17 * 8) = *(undefined8 *)(lVar10 + lVar9 * 8);
      *(undefined8 *)(lVar10 + lVar9 * 8) = uVar5;
      uVar11 = *(undefined4 *)(parentRef.ptr + 0x20 + lVar17 * 4);
      *(undefined4 *)(parentRef.ptr + 0x20 + lVar17 * 4) =
           *(undefined4 *)(lVar10 + 0x20 + lVar9 * 4);
      *(undefined4 *)(lVar10 + 0x20 + lVar9 * 4) = uVar11;
      uVar11 = *(undefined4 *)(parentRef.ptr + 0x40 + lVar17 * 4);
      *(undefined4 *)(parentRef.ptr + 0x40 + lVar17 * 4) =
           *(undefined4 *)(lVar10 + 0x40 + lVar9 * 4);
      *(undefined4 *)(lVar10 + 0x40 + lVar9 * 4) = uVar11;
      uVar11 = *(undefined4 *)(parentRef.ptr + 0x60 + lVar17 * 4);
      *(undefined4 *)(parentRef.ptr + 0x60 + lVar17 * 4) =
           *(undefined4 *)(lVar10 + 0x60 + lVar9 * 4);
      *(undefined4 *)(lVar10 + 0x60 + lVar9 * 4) = uVar11;
      uVar11 = *(undefined4 *)(parentRef.ptr + 0x30 + lVar17 * 4);
      *(undefined4 *)(parentRef.ptr + 0x30 + lVar17 * 4) =
           *(undefined4 *)(lVar10 + 0x30 + lVar9 * 4);
      *(undefined4 *)(lVar10 + 0x30 + lVar9 * 4) = uVar11;
      uVar11 = *(undefined4 *)(parentRef.ptr + 0x50 + lVar17 * 4);
      *(undefined4 *)(parentRef.ptr + 0x50 + lVar17 * 4) =
           *(undefined4 *)(lVar10 + 0x50 + lVar9 * 4);
      *(undefined4 *)(lVar10 + 0x50 + lVar9 * 4) = uVar11;
      uVar11 = *(undefined4 *)(parentRef.ptr + 0x70 + lVar17 * 4);
      *(undefined4 *)(parentRef.ptr + 0x70 + lVar17 * 4) =
           *(undefined4 *)(lVar10 + 0x70 + lVar9 * 4);
      *(undefined4 *)(lVar10 + 0x70 + lVar9 * 4) = uVar11;
      auVar26 = *(undefined1 (*) [16])(lVar10 + 0x20);
      auVar22 = *(undefined1 (*) [16])(lVar10 + 0x30);
      auVar23 = *(undefined1 (*) [16])(lVar10 + 0x40);
      auVar4 = *(undefined1 (*) [16])(lVar10 + 0x50);
      auVar19 = vshufps_avx(auVar26,auVar26,0xb1);
      auVar26 = vminps_avx(auVar19,auVar26);
      auVar19 = vshufpd_avx(auVar26,auVar26,1);
      auVar19 = vminss_avx(auVar19,auVar26);
      auVar26 = vshufps_avx(auVar23,auVar23,0xb1);
      auVar26 = vminps_avx(auVar26,auVar23);
      auVar23 = vshufpd_avx(auVar26,auVar26,1);
      auVar20 = vminss_avx(auVar23,auVar26);
      auVar26 = *(undefined1 (*) [16])(lVar10 + 0x60);
      auVar23 = vshufps_avx(auVar26,auVar26,0xb1);
      auVar26 = vminps_avx(auVar23,auVar26);
      auVar23 = vshufpd_avx(auVar26,auVar26,1);
      auVar29 = vminss_avx(auVar23,auVar26);
      auVar26 = vshufps_avx(auVar22,auVar22,0xb1);
      auVar26 = vmaxps_avx(auVar26,auVar22);
      auVar22 = vshufpd_avx(auVar26,auVar26,1);
      auVar22 = vmaxss_avx(auVar22,auVar26);
      auVar26 = vshufps_avx(auVar4,auVar4,0xb1);
      auVar26 = vmaxps_avx(auVar26,auVar4);
      auVar23 = vshufpd_avx(auVar26,auVar26,1);
      auVar23 = vmaxss_avx(auVar23,auVar26);
      auVar26 = *(undefined1 (*) [16])(lVar10 + 0x70);
      auVar4 = vshufps_avx(auVar26,auVar26,0xb1);
      auVar26 = vmaxps_avx(auVar4,auVar26);
      auVar4 = vshufpd_avx(auVar26,auVar26,1);
      auVar26 = vmaxss_avx(auVar4,auVar26);
      *(int *)(parentRef.ptr + 0x20 + lVar7 * 4) = auVar19._0_4_;
      *(int *)(parentRef.ptr + 0x40 + lVar7 * 4) = auVar20._0_4_;
      *(int *)(parentRef.ptr + 0x60 + lVar7 * 4) = auVar29._0_4_;
      *(int *)(parentRef.ptr + 0x30 + lVar7 * 4) = auVar22._0_4_;
      *(int *)(parentRef.ptr + 0x50 + lVar7 * 4) = auVar23._0_4_;
      *(int *)(parentRef.ptr + 0x70 + lVar7 * 4) = auVar26._0_4_;
      lVar7 = 3;
      do {
        if (*(long *)(parentRef.ptr + lVar7 * 8) != 8) {
          if (0 < lVar7) {
            lVar9 = 0;
            do {
              if (*(long *)(parentRef.ptr + lVar9 * 8) == 8) {
                *(undefined8 *)(parentRef.ptr + lVar9 * 8) =
                     *(undefined8 *)(parentRef.ptr + lVar7 * 8);
                *(undefined8 *)(parentRef.ptr + lVar7 * 8) = 8;
                uVar11 = *(undefined4 *)(parentRef.ptr + 0x20 + lVar9 * 4);
                *(undefined4 *)(parentRef.ptr + 0x20 + lVar9 * 4) =
                     *(undefined4 *)(parentRef.ptr + 0x20 + lVar7 * 4);
                *(undefined4 *)(parentRef.ptr + 0x20 + lVar7 * 4) = uVar11;
                uVar11 = *(undefined4 *)(parentRef.ptr + 0x40 + lVar9 * 4);
                *(undefined4 *)(parentRef.ptr + 0x40 + lVar9 * 4) =
                     *(undefined4 *)(parentRef.ptr + 0x40 + lVar7 * 4);
                *(undefined4 *)(parentRef.ptr + 0x40 + lVar7 * 4) = uVar11;
                uVar11 = *(undefined4 *)(parentRef.ptr + 0x60 + lVar9 * 4);
                *(undefined4 *)(parentRef.ptr + 0x60 + lVar9 * 4) =
                     *(undefined4 *)(parentRef.ptr + 0x60 + lVar7 * 4);
                *(undefined4 *)(parentRef.ptr + 0x60 + lVar7 * 4) = uVar11;
                uVar11 = *(undefined4 *)(parentRef.ptr + 0x30 + lVar9 * 4);
                *(undefined4 *)(parentRef.ptr + 0x30 + lVar9 * 4) =
                     *(undefined4 *)(parentRef.ptr + 0x30 + lVar7 * 4);
                *(undefined4 *)(parentRef.ptr + 0x30 + lVar7 * 4) = uVar11;
                uVar11 = *(undefined4 *)(parentRef.ptr + 0x50 + lVar9 * 4);
                *(undefined4 *)(parentRef.ptr + 0x50 + lVar9 * 4) =
                     *(undefined4 *)(parentRef.ptr + 0x50 + lVar7 * 4);
                *(undefined4 *)(parentRef.ptr + 0x50 + lVar7 * 4) = uVar11;
                uVar11 = *(undefined4 *)(parentRef.ptr + 0x70 + lVar9 * 4);
                *(undefined4 *)(parentRef.ptr + 0x70 + lVar9 * 4) =
                     *(undefined4 *)(parentRef.ptr + 0x70 + lVar7 * 4);
                *(undefined4 *)(parentRef.ptr + 0x70 + lVar7 * 4) = uVar11;
                lVar8 = lVar7;
                lVar14 = lVar7 + -1;
                if (lVar9 < lVar7 + -1) {
                  lVar14 = lVar9;
                }
                do {
                  lVar1 = lVar8 + -1;
                  lVar7 = lVar14;
                  if (lVar1 <= lVar9) break;
                  lVar2 = lVar8 * 8;
                  lVar8 = lVar1;
                  lVar7 = lVar1;
                } while (*(long *)((parentRef.ptr - 8) + lVar2) == 8);
              }
              lVar9 = lVar9 + 1;
            } while (lVar9 < lVar7);
          }
          break;
        }
        bVar18 = lVar7 != 0;
        lVar7 = lVar7 + -1;
      } while (bVar18);
      lVar7 = 3;
      do {
        if (*(long *)(lVar10 + lVar7 * 8) != 8) {
          if (0 < lVar7) {
            lVar9 = 0;
            do {
              if (*(long *)(lVar10 + lVar9 * 8) == 8) {
                *(undefined8 *)(lVar10 + lVar9 * 8) = *(undefined8 *)(lVar10 + lVar7 * 8);
                *(undefined8 *)(lVar10 + lVar7 * 8) = 8;
                uVar11 = *(undefined4 *)(lVar10 + 0x20 + lVar9 * 4);
                *(undefined4 *)(lVar10 + 0x20 + lVar9 * 4) =
                     *(undefined4 *)(lVar10 + 0x20 + lVar7 * 4);
                *(undefined4 *)(lVar10 + 0x20 + lVar7 * 4) = uVar11;
                uVar11 = *(undefined4 *)(lVar10 + 0x40 + lVar9 * 4);
                *(undefined4 *)(lVar10 + 0x40 + lVar9 * 4) =
                     *(undefined4 *)(lVar10 + 0x40 + lVar7 * 4);
                *(undefined4 *)(lVar10 + 0x40 + lVar7 * 4) = uVar11;
                uVar11 = *(undefined4 *)(lVar10 + 0x60 + lVar9 * 4);
                *(undefined4 *)(lVar10 + 0x60 + lVar9 * 4) =
                     *(undefined4 *)(lVar10 + 0x60 + lVar7 * 4);
                *(undefined4 *)(lVar10 + 0x60 + lVar7 * 4) = uVar11;
                uVar11 = *(undefined4 *)(lVar10 + 0x30 + lVar9 * 4);
                *(undefined4 *)(lVar10 + 0x30 + lVar9 * 4) =
                     *(undefined4 *)(lVar10 + 0x30 + lVar7 * 4);
                *(undefined4 *)(lVar10 + 0x30 + lVar7 * 4) = uVar11;
                uVar11 = *(undefined4 *)(lVar10 + 0x50 + lVar9 * 4);
                *(undefined4 *)(lVar10 + 0x50 + lVar9 * 4) =
                     *(undefined4 *)(lVar10 + 0x50 + lVar7 * 4);
                *(undefined4 *)(lVar10 + 0x50 + lVar7 * 4) = uVar11;
                uVar11 = *(undefined4 *)(lVar10 + 0x70 + lVar9 * 4);
                *(undefined4 *)(lVar10 + 0x70 + lVar9 * 4) =
                     *(undefined4 *)(lVar10 + 0x70 + lVar7 * 4);
                *(undefined4 *)(lVar10 + 0x70 + lVar7 * 4) = uVar11;
                lVar8 = lVar7;
                lVar14 = lVar7 + -1;
                if (lVar9 < lVar7 + -1) {
                  lVar14 = lVar9;
                }
                do {
                  lVar1 = lVar8 + -1;
                  lVar7 = lVar14;
                  if (lVar1 <= lVar9) break;
                  lVar2 = lVar8 * 8;
                  lVar8 = lVar1;
                  lVar7 = lVar1;
                } while (*(long *)(lVar10 + -8 + lVar2) == 8);
              }
              lVar9 = lVar9 + 1;
            } while (lVar9 < lVar7);
          }
          break;
        }
        bVar18 = lVar7 != 0;
        lVar7 = lVar7 + -1;
      } while (bVar18);
      *(int *)(local_198 + lVar17 * 4) = *(int *)(local_198 + lVar17 * 4) + 1;
    }
    auVar26 = vpshufd_avx(local_198,0xb1);
    auVar26 = vpmaxsd_avx(auVar26,local_198);
    auVar22 = vpshufd_avx(auVar26,0x4e);
    auVar26 = vpmaxsd_avx(auVar22,auVar26);
    sVar6 = (size_t)(auVar26._0_4_ + 1);
  }
  else {
    sVar6 = 0;
  }
  return sVar6;
}

Assistant:

size_t BVHNRotate<4>::rotate(NodeRef parentRef, size_t depth)
    {
      /*! nothing to rotate if we reached a leaf node. */
      if (parentRef.isBarrier()) return 0;
      if (parentRef.isLeaf()) return 0;
      AABBNode* parent = parentRef.getAABBNode();
      
      /*! rotate all children first */
      vint4 cdepth;
      for (size_t c=0; c<4; c++)
	cdepth[c] = (int)rotate(parent->child(c),depth+1);
      
      /* compute current areas of all children */
      vfloat4 sizeX = parent->upper_x-parent->lower_x;
      vfloat4 sizeY = parent->upper_y-parent->lower_y;
      vfloat4 sizeZ = parent->upper_z-parent->lower_z;
      vfloat4 childArea = madd(sizeX,(sizeY + sizeZ),sizeY*sizeZ);
      
      /*! get node bounds */
      BBox<vfloat4> child1_0,child1_1,child1_2,child1_3;
      parent->bounds(child1_0,child1_1,child1_2,child1_3);
      
      /*! Find best rotation. We pick a first child (child1) and a sub-child 
	(child2child) of a different second child (child2), and swap child1 
	and child2child. We perform the best such swap. */
      float bestArea = 0;
      size_t bestChild1 = -1, bestChild2 = -1, bestChild2Child = -1;
      for (size_t c2=0; c2<4; c2++)
      {
	/*! ignore leaf nodes as we cannot descent into them */
	if (parent->child(c2).isBarrier()) continue;
	if (parent->child(c2).isLeaf()) continue;
	AABBNode* child2 = parent->child(c2).getAABBNode();
	
	/*! transpose child bounds */
	BBox<vfloat4> child2c0,child2c1,child2c2,child2c3;
	child2->bounds(child2c0,child2c1,child2c2,child2c3);
	
	/*! put child1_0 at each child2 position */
	float cost00 = halfArea3f(merge(child1_0,child2c1,child2c2,child2c3));
	float cost01 = halfArea3f(merge(child2c0,child1_0,child2c2,child2c3));
	float cost02 = halfArea3f(merge(child2c0,child2c1,child1_0,child2c3));
	float cost03 = halfArea3f(merge(child2c0,child2c1,child2c2,child1_0));
	vfloat4 cost0 = vfloat4(cost00,cost01,cost02,cost03);
	vfloat4 min0 = vreduce_min(cost0);
	int pos0 = (int)bsf(movemask(min0 == cost0));
	
	/*! put child1_1 at each child2 position */
	float cost10 = halfArea3f(merge(child1_1,child2c1,child2c2,child2c3));
	float cost11 = halfArea3f(merge(child2c0,child1_1,child2c2,child2c3));
	float cost12 = halfArea3f(merge(child2c0,child2c1,child1_1,child2c3));
	float cost13 = halfArea3f(merge(child2c0,child2c1,child2c2,child1_1));
	vfloat4 cost1 = vfloat4(cost10,cost11,cost12,cost13);
	vfloat4 min1 = vreduce_min(cost1);
	int pos1 = (int)bsf(movemask(min1 == cost1));
	
	/*! put child1_2 at each child2 position */
	float cost20 = halfArea3f(merge(child1_2,child2c1,child2c2,child2c3));
	float cost21 = halfArea3f(merge(child2c0,child1_2,child2c2,child2c3));
	float cost22 = halfArea3f(merge(child2c0,child2c1,child1_2,child2c3));
	float cost23 = halfArea3f(merge(child2c0,child2c1,child2c2,child1_2));
	vfloat4 cost2 = vfloat4(cost20,cost21,cost22,cost23);
	vfloat4 min2 = vreduce_min(cost2);
	int pos2 = (int)bsf(movemask(min2 == cost2));
	
	/*! put child1_3 at each child2 position */
	float cost30 = halfArea3f(merge(child1_3,child2c1,child2c2,child2c3));
	float cost31 = halfArea3f(merge(child2c0,child1_3,child2c2,child2c3));
	float cost32 = halfArea3f(merge(child2c0,child2c1,child1_3,child2c3));
	float cost33 = halfArea3f(merge(child2c0,child2c1,child2c2,child1_3));
	vfloat4 cost3 = vfloat4(cost30,cost31,cost32,cost33);
	vfloat4 min3 = vreduce_min(cost3);
	int pos3 = (int)bsf(movemask(min3 == cost3));
	
	/*! find best other child */
	vfloat4 area0123 = vfloat4(extract<0>(min0),extract<0>(min1),extract<0>(min2),extract<0>(min3)) - vfloat4(childArea[c2]);
	int pos[4] = { pos0,pos1,pos2,pos3 };
	const size_t mbd = BVH4::maxBuildDepth;
	vbool4 valid = vint4(int(depth+1))+cdepth <= vint4(mbd); // only select swaps that fulfill depth constraints
	valid &= vint4(int(c2)) != vint4(step);
	if (none(valid)) continue;
	size_t c1 = select_min(valid,area0123);
	float area = area0123[c1]; 
        if (c1 == c2) continue; // can happen if bounds are NANs
	
	/*! accept a swap when it reduces cost and is not swapping a node with itself */
	if (area < bestArea) {
	  bestArea = area;
	  bestChild1 = c1;
	  bestChild2 = c2;
	  bestChild2Child = pos[c1];
	}
      }
      
      /*! if we did not find a swap that improves the SAH then do nothing */
      if (bestChild1 == size_t(-1)) return 1+reduce_max(cdepth);
      
      /*! perform the best found tree rotation */
      AABBNode* child2 = parent->child(bestChild2).getAABBNode();
      AABBNode::swap(parent,bestChild1,child2,bestChild2Child);
      parent->setBounds(bestChild2,child2->bounds());
      AABBNode::compact(parent);
      AABBNode::compact(child2);
      
      /*! This returned depth is conservative as the child that was
       *  pulled up in the tree could have been on the critical path. */
      cdepth[bestChild1]++; // bestChild1 was pushed down one level
      return 1+reduce_max(cdepth); 
    }